

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O1

bool FIX::double_conversion::isWhitespace(int x)

{
  long lVar1;
  ulong uVar2;
  
  if (x < 0x80) {
    if (x != 0x20) {
      uVar2 = 0xffffffffffffffff;
      do {
        if (uVar2 == 4) {
          return false;
        }
        lVar1 = uVar2 + 2;
        uVar2 = uVar2 + 1;
      } while (*(char *)((long)&kWhitespaceTable7 + lVar1) != x);
      if (4 < uVar2) {
        return false;
      }
    }
  }
  else if (x != 0xa0) {
    uVar2 = 0xffffffffffffffff;
    do {
      if (uVar2 == 0x12) {
        return false;
      }
      lVar1 = uVar2 * 2;
      uVar2 = uVar2 + 1;
    } while ((uint)*(ushort *)(kWhitespaceTable16 + lVar1 + 4) != x);
    if (0x12 < uVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool isWhitespace(int x) {
#endif
  if (x < 128) {
    for (int i = 0; i < kWhitespaceTable7Length; i++) {
      if (kWhitespaceTable7[i] == x) return true;
    }
  } else {
    for (int i = 0; i < kWhitespaceTable16Length; i++) {
      if (kWhitespaceTable16[i] == x) return true;
    }
  }
  return false;
}